

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

lyd_node *
resolve_partial_json_data_nodeid
          (char *nodeid,char *llist_value,lyd_node *start,int options,int *parsed)

{
  byte bVar1;
  char cVar2;
  LYS_NODE LVar3;
  parsed_pred pp_00;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  lys_module *plVar7;
  long lVar8;
  lys_node *node;
  lys_node *plVar9;
  void *pvVar10;
  size_t sVar11;
  char *pcVar12;
  lyd_node *node_00;
  lys_node *plVar13;
  char *pcVar14;
  ushort **ppuVar15;
  lys_module *plVar16;
  undefined4 extraout_var_00;
  char *pcVar17;
  LY_ERR no;
  LY_VLOG_ELEM elem_type;
  long *plVar18;
  LY_ECODE LVar19;
  ly_ctx *plVar20;
  ulong uVar21;
  lyd_node *plVar22;
  lyd_node *plVar23;
  long lVar24;
  hash_table *phVar25;
  char *pcVar26;
  char *local_c8;
  char *mod_name;
  char *local_b8;
  char *name;
  ly_ctx *local_a8;
  uint local_9c;
  lyd_node *local_98;
  int local_90;
  int local_8c;
  int mod_name_len;
  int nam_len;
  lyd_node *local_80;
  lys_node *plStack_78;
  parsed_pred pp;
  int local_4c;
  ly_ctx *plStack_48;
  int is_relative;
  int *local_40;
  int local_34 [2];
  int has_predicate;
  
  local_4c = -1;
  local_9c = options;
  if (((nodeid == (char *)0x0) || (start == (lyd_node *)0x0)) || (parsed == (int *)0x0)) {
    __assert_fail("nodeid && start && parsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0xa43,
                  "struct lyd_node *resolve_partial_json_data_nodeid(const char *, const char *, struct lyd_node *, int, int *)"
                 );
  }
  plStack_78 = (lys_node *)0x0;
  pp.schema = (lys_node *)0x0;
  pp.len = 0;
  pp._12_4_ = 0;
  plVar20 = start->schema->module->ctx;
  uVar4 = parse_schema_nodeid(nodeid,&local_c8,&local_90,&local_b8,&local_8c,&local_4c,(int *)0x0,
                              (int *)0x0,1);
  if ((int)uVar4 < 1) {
    local_b8 = nodeid + -uVar4;
    cVar2 = nodeid[-uVar4];
LAB_00114600:
    uVar21 = (ulong)(uint)(int)cVar2;
  }
  else {
    if (*local_b8 != '#') {
      local_4c = -1;
      name = (char *)0x0;
LAB_00114579:
      uVar4 = parse_schema_nodeid(nodeid,&local_c8,&local_90,&local_b8,&local_8c,&local_4c,local_34,
                                  (int *)0x0,0);
      if (0 < (int)uVar4) {
        plStack_48 = plVar20;
        local_40 = parsed;
        if (local_4c == 0) {
          do {
            plVar22 = start;
            start = plVar22->parent;
          } while (plVar22->parent != (lyd_node *)0x0);
          plVar7 = lyd_node_module(plVar22);
        }
        else {
          plVar7 = lyd_node_module(start);
          if (((start->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) ==
               LYS_UNKNOWN) || (plVar22 = start->child, plVar22 == (lyd_node *)0x0)) {
            return (lyd_node *)0x0;
          }
        }
        pcVar26 = nodeid + uVar4;
        pcVar12 = (char *)(ulong)((int)name + uVar4);
        pcVar17 = "";
        if (llist_value != (char *)0x0) {
          pcVar17 = llist_value;
        }
        local_98 = (lyd_node *)0x0;
LAB_00114691:
        node_00 = plVar22;
        free((void *)pp._8_8_);
        plStack_78 = (lys_node *)0x0;
        pp.schema = (lys_node *)((ulong)pp.schema & 0xffffffff00000000);
        pp.len = 0;
        pp._12_4_ = 0;
        while (local_34[0] != 0) {
          lVar8 = (long)(int)pp.schema;
          pp.schema = (lys_node *)CONCAT44(pp.schema._4_4_,(int)(lVar8 + 1));
          pp._8_8_ = ly_realloc((void *)pp._8_8_,(lVar8 + 1) * 0x30);
          if ((void *)pp._8_8_ == (void *)0x0) goto LAB_00114dd6;
          lVar8 = (long)(int)pp.schema * 0x30;
          uVar4 = parse_schema_json_predicate
                            (pcVar26,(char **)(pp._8_8_ + lVar8 + -0x30),
                             (int *)(pp._8_8_ + lVar8 + -0x28),(char **)(pp._8_8_ + lVar8 + -0x20),
                             (int *)(pp._8_8_ + lVar8 + -0x18),(char **)(pp._8_8_ + lVar8 + -0x10),
                             (int *)(pp._8_8_ + lVar8 + -8),local_34);
          if ((int)uVar4 < 1) {
            uVar4 = (uint)*pcVar26;
            goto LAB_00114dfc;
          }
          pcVar26 = pcVar26 + uVar4;
          pcVar12 = (char *)(ulong)((int)pcVar12 + uVar4);
        }
        if (node_00->parent == (lyd_node *)0x0) {
          plVar13 = (lys_node *)0x0;
        }
        else {
          plVar13 = node_00->parent->schema;
        }
        name = pcVar12;
        node = lys_getnext((lys_node *)0x0,plVar13,plVar7,0);
        plVar23 = local_98;
        if (node != (lys_node *)0x0) {
          do {
            if ((plVar13 == (lys_node *)0x0) ||
               ((plVar13->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
LAB_0011478b:
              iVar5 = schema_nodeid_siblingcheck(node,plVar7,local_c8,local_90,local_b8,local_8c);
              if (iVar5 == 0) goto LAB_001147d2;
            }
            else {
              plVar9 = lys_parent(node);
              if ((local_9c & 4) == 0) {
                if (plVar9->nodetype != LYS_OUTPUT) goto LAB_0011478b;
              }
              else if (plVar9->nodetype != LYS_INPUT) goto LAB_0011478b;
            }
            node = lys_getnext(node,plVar13,plVar7,0);
            plVar23 = local_98;
            if (node == (lys_node *)0x0) break;
          } while( true );
        }
        goto LAB_0011461f;
      }
      local_b8 = nodeid + -uVar4;
      cVar2 = nodeid[-uVar4];
      goto LAB_00114600;
    }
    if (local_4c == 0) {
      nodeid = nodeid + uVar4;
      name = (char *)CONCAT44(extraout_var,uVar4);
      goto LAB_00114579;
    }
    uVar21 = 0x23;
  }
  ly_vlog(plVar20,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar21,local_b8);
LAB_00114616:
  *parsed = -1;
  plVar23 = (lyd_node *)0x0;
LAB_0011461f:
  free((void *)pp._8_8_);
  return plVar23;
LAB_001147d2:
  LVar3 = node->nodetype;
  iVar5 = (int)pp.schema;
  plStack_78 = node;
  if (((int)pp.schema == 0 && *pcVar26 == '\0') && (iVar5 = 0, LVar3 == LYS_LEAFLIST)) {
    pp.schema = (lys_node *)CONCAT44(pp.schema._4_4_,1);
    pvVar10 = calloc(1,0x30);
    pp._8_8_ = pvVar10;
    if (pvVar10 == (void *)0x0) {
LAB_00114dd6:
      pcVar17 = "Memory allocation failed (%s()).";
      pcVar26 = "resolve_partial_json_data_nodeid";
      no = LY_EMEM;
LAB_00114def:
      ly_log(plStack_48,LY_LLERR,no,pcVar17,pcVar26);
      parsed = local_40;
      goto LAB_00114616;
    }
    *(char **)((long)pvVar10 + 0x10) = ".";
    *(undefined4 *)((long)pvVar10 + 0x18) = 1;
    *(char **)((long)pvVar10 + 0x20) = pcVar17;
    sVar11 = strlen(pcVar17);
    *(int *)((long)pvVar10 + 0x28) = (int)sVar11;
LAB_00114875:
    mod_name = (char *)&node->nodetype;
    pcVar12 = *(char **)(pp._8_8_ + 0x10);
    uVar21 = (ulong)(uint)(int)*pcVar12;
    if (((int)*pcVar12 != 0x2e) || (*(int *)(pp._8_8_ + 0x18) != 1)) goto LAB_00114ede;
    if ((*(int *)&node[1].ref == 7) &&
       (pcVar12 = strnchr(*(char **)(pp._8_8_ + 0x20),0x3a,*(uint *)(pp._8_8_ + 0x28)),
       pcVar12 == (char *)0x0)) {
      uVar21 = (ulong)*(uint *)(pp._8_8_ + 0x28);
      pcVar26 = *(char **)(pp._8_8_ + 0x20);
      LVar19 = LYE_PATH_INIDENTREF;
      elem_type = LY_VLOG_LYS;
      goto LAB_00114e0c;
    }
  }
  else {
    mod_name = (char *)&node->nodetype;
    if ((LVar3 & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      if (LVar3 == LYS_LIST) {
        if (iVar5 == 0) {
          return local_98;
        }
        ppuVar15 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar15 + (long)**(char **)(pp._8_8_ + 0x10) * 2 + 1) & 8) == 0) {
          if ((int)(uint)node->padding[2] < iVar5) goto LAB_00114eba;
          if (iVar5 < (int)(uint)node->padding[2]) {
            pcVar12 = (char *)**(undefined8 **)(*(long *)&node[1].flags + (long)iVar5 * 8);
            LVar19 = LYE_PATH_MISSKEY;
            plVar20 = plStack_48;
LAB_00114e7e:
            ly_vlog(plVar20,LVar19,LY_VLOG_NONE,(void *)0x0,pcVar12);
            parsed = local_40;
            goto LAB_00114616;
          }
          lVar8 = 5;
          lVar24 = 0;
          do {
            if (*(int *)(*(long *)(*(long *)&node[1].flags + lVar24 * 8) + 0x80) == 7) {
              pcVar12 = strnchr(*(char **)(pp._8_8_ + -8 + lVar8 * 8),0x3a,
                                *(uint *)(pp._8_8_ + lVar8 * 8));
              if (pcVar12 == (char *)0x0) {
                node = *(lys_node **)(*(long *)&node[1].flags + lVar24 * 8);
                uVar21 = (ulong)*(uint *)(pp._8_8_ + lVar8 * 8);
                pcVar26 = *(char **)(pp._8_8_ + -8 + lVar8 * 8);
                LVar19 = LYE_PATH_INIDENTREF;
                elem_type = LY_VLOG_LYS;
                goto LAB_00114e0c;
              }
              iVar5 = (int)pp.schema;
            }
            lVar24 = lVar24 + 1;
            lVar8 = lVar8 + 6;
          } while (lVar24 < iVar5);
        }
      }
      else if (pp._8_8_ != 0) goto LAB_00114eba;
    }
    else {
      if (1 < iVar5) {
LAB_00114eba:
        ly_vlog(plStack_48,LYE_PATH_PREDTOOMANY,LY_VLOG_NONE,(void *)0x0);
        parsed = local_40;
        goto LAB_00114616;
      }
      if (iVar5 != 0) goto LAB_00114875;
    }
  }
  plVar22 = node_00->parent;
  if ((plVar22 != (lyd_node *)0x0) && (plVar22->ht != (hash_table *)0x0)) {
    if (plStack_78->nodetype == LYS_LEAFLIST) {
      bVar1 = (byte)plStack_78->flags & 1;
    }
    else {
      if (plStack_78->nodetype != LYS_LIST) goto LAB_00114991;
      bVar1 = plStack_78->padding[2];
    }
    if (bVar1 != 0) {
LAB_00114991:
      pp_00._8_8_ = pp.schema;
      pp_00.schema = plStack_78;
      pp_00.pred._0_4_ = pp.len;
      pp_00.pred._4_4_ = pp._12_4_;
      node_00 = resolve_json_data_node_hash(plVar22,pp_00);
LAB_001149aa:
      plVar23 = local_98;
      if (node_00 == (lyd_node *)0x0) goto LAB_0011461f;
LAB_00114d21:
      *local_40 = *local_40 + (int)name;
      plVar7 = lyd_node_module(node_00);
      uVar4 = (uint)*pcVar26;
      plVar23 = node_00;
      if (uVar4 == 0) goto LAB_0011461f;
      if ((*(ushort *)mod_name & 0x802c) != 0) {
LAB_00114dfc:
        uVar21 = (ulong)uVar4;
        LVar19 = LYE_PATH_INCHAR;
        elem_type = LY_VLOG_NONE;
        node = (lys_node *)0x0;
        goto LAB_00114e0c;
      }
      plVar22 = node_00->child;
      if (plVar22 == (lyd_node *)0x0) goto LAB_0011461f;
      uVar4 = parse_schema_nodeid(pcVar26,&local_c8,&local_90,&local_b8,&local_8c,&local_4c,local_34
                                  ,(int *)0x0,0);
      pcVar12 = (char *)CONCAT44(extraout_var_00,uVar4);
      if ((int)uVar4 < 1) goto LAB_00114ed3;
      pcVar26 = pcVar26 + uVar4;
      local_98 = node_00;
      goto LAB_00114691;
    }
  }
  iVar5 = 0;
  do {
    plVar13 = lys_parent(node_00->schema);
    if (plVar13 != (lys_node *)0x0) {
      plVar13 = lys_parent(node_00->schema);
      if ((local_9c & 4) == 0) {
        if (plVar13->nodetype == LYS_OUTPUT) {
          pcVar26 = node_00->schema->name;
          pcVar17 = "Provided data tree includes some RPC output nodes (%s).";
LAB_00114e53:
          no = LY_EINVAL;
          goto LAB_00114def;
        }
      }
      else if (plVar13->nodetype == LYS_INPUT) {
        pcVar26 = node_00->schema->name;
        pcVar17 = "Provided data tree includes some RPC input nodes (%s).";
        goto LAB_00114e53;
      }
    }
    plVar18 = (long *)pp._8_8_;
    plVar13 = node_00->schema;
    if (plVar13 == node) {
      if (*(int *)mod_name == 0x10) {
        if (plVar13->nodetype != LYS_LIST) {
          __assert_fail("node->schema->nodetype == LYS_LIST",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x9e5,
                        "int resolve_partial_json_data_list_predicate(struct parsed_pred, struct lyd_node *, int)"
                       );
        }
        if ((int)pp.schema == 0) {
          __assert_fail("pp.len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x9e6,
                        "int resolve_partial_json_data_list_predicate(struct parsed_pred, struct lyd_node *, int)"
                       );
        }
        iVar5 = iVar5 + 1;
        local_a8 = plVar13->module->ctx;
        ppuVar15 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar15 + (long)**(char **)((long)plVar18 + 0x10) * 2 + 1) & 8) == 0)
        {
          plVar22 = node_00->child;
          if (plVar22 != (lyd_node *)0x0) {
            if (plVar13->padding[2] != '\0') {
              uVar21 = 0;
              do {
                pcVar14 = plVar22->schema->name;
                pcVar12 = (char *)plVar18[2];
                lVar8 = plVar18[3];
                _mod_name_len = plVar18;
                local_80 = plVar22;
                iVar6 = strncmp(pcVar14,pcVar12,(long)(int)lVar8);
                plVar18 = _mod_name_len;
                if ((iVar6 != 0) || (pcVar14[(int)lVar8] != '\0')) {
                  LVar19 = LYE_PATH_INKEY;
                  plVar20 = local_a8;
                  goto LAB_00114e7e;
                }
                lVar8 = *_mod_name_len;
                plVar7 = lyd_node_module(local_80);
                if (lVar8 == 0) {
                  plVar16 = lyd_node_module(node_00);
                  plVar22 = local_80;
                  if (plVar7 != plVar16) {
LAB_00114e66:
                    pcVar12 = (char *)_mod_name_len[2];
LAB_00114e6e:
                    LVar19 = LYE_PATH_INKEY;
                    plVar20 = local_a8;
                    goto LAB_00114e7e;
                  }
                }
                else {
                  iVar6 = strncmp(plVar7->name,(char *)*plVar18,(long)(int)plVar18[1]);
                  plVar22 = local_80;
                  if ((iVar6 != 0) ||
                     (plVar7 = lyd_node_module(local_80), plVar7->name[(int)plVar18[1]] != '\0')) {
                    pcVar12 = (char *)plVar18[2];
                    goto LAB_00114e6e;
                  }
                  plVar7 = lyd_node_module(plVar22);
                  plVar16 = lyd_node_module(node_00);
                  if (plVar7 == plVar16) goto LAB_00114e66;
                }
                pcVar12 = lyd_make_canonical(plVar22->schema,(char *)_mod_name_len[4],
                                             (int)_mod_name_len[5]);
                parsed = local_40;
                if (pcVar12 == (char *)0x0) goto LAB_00114616;
                iVar6 = strcmp((char *)plVar22->ht,pcVar12);
                local_80 = (lyd_node *)CONCAT44(local_80._4_4_,iVar6);
                free(pcVar12);
                if ((int)local_80 != 0) goto LAB_00114a13;
                plVar22 = plVar22->next;
                uVar21 = uVar21 + 1;
                plVar18 = _mod_name_len + 6;
                if (plVar13->padding[2] <= uVar21) goto LAB_001149aa;
              } while( true );
            }
            goto LAB_00114d21;
          }
        }
        else {
          iVar6 = atoi(*(char **)((long)plVar18 + 0x10));
          if (iVar6 == iVar5) goto LAB_00114d21;
        }
      }
      else {
        if (*(int *)mod_name != 8) goto LAB_00114d21;
        if ((node->flags & 2) == 0) {
          if ((pp._8_8_ == 0) || (pcVar12 = *(char **)(pp._8_8_ + 0x20), pcVar12 == (char *)0x0)) {
            if (node_00->ht == (hash_table *)0x0) goto LAB_00114d21;
            cVar2 = (char)node_00->ht->used;
          }
          else {
            _mod_name_len = (long *)(long)*(int *)(pp._8_8_ + 0x28);
            pcVar14 = strchr(pcVar12,0x3a);
            if ((pcVar14 == (char *)0x0) && (((ulong)node_00[1].schema & 7) != 0)) {
              local_80 = (lyd_node *)node_00->ht;
              plVar7 = lyd_node_module(node_00);
              pcVar14 = plVar7->name;
              plVar7 = lyd_node_module(node_00);
              sVar11 = strlen(plVar7->name);
              iVar6 = strncmp((char *)local_80,pcVar14,sVar11);
              if (iVar6 != 0) goto LAB_00114a76;
              phVar25 = node_00->ht;
              plVar7 = lyd_node_module(node_00);
              sVar11 = strlen(plVar7->name);
              if (*(char *)((long)&phVar25->used + sVar11) != ':') goto LAB_00114a76;
              phVar25 = node_00->ht;
              plVar7 = lyd_node_module(node_00);
              sVar11 = strlen(plVar7->name);
              phVar25 = (hash_table *)((long)&phVar25->used + sVar11 + 1);
            }
            else {
LAB_00114a76:
              phVar25 = node_00->ht;
            }
            plVar18 = _mod_name_len;
            iVar6 = strncmp(pcVar12,(char *)phVar25,(size_t)_mod_name_len);
            if (iVar6 != 0) goto LAB_00114a13;
            cVar2 = *(char *)((long)&phVar25->used + (long)plVar18);
          }
          if (cVar2 == '\0') goto LAB_00114d21;
        }
      }
    }
LAB_00114a13:
    node_00 = node_00->next;
    plVar23 = local_98;
    if (node_00 == (lyd_node *)0x0) goto LAB_0011461f;
  } while( true );
LAB_00114ed3:
  uVar21 = (ulong)(uint)(int)pcVar26[-uVar4];
  pcVar12 = pcVar26 + -uVar4;
LAB_00114ede:
  pcVar26 = pcVar12;
  LVar19 = LYE_PATH_INCHAR;
  elem_type = LY_VLOG_NONE;
  node = (lys_node *)0x0;
LAB_00114e0c:
  ly_vlog(plStack_48,LVar19,elem_type,node,uVar21,pcVar26);
  parsed = local_40;
  goto LAB_00114616;
}

Assistant:

struct lyd_node *
resolve_partial_json_data_nodeid(const char *nodeid, const char *llist_value, struct lyd_node *start, int options,
                                 int *parsed)
{
    const char *id, *mod_name, *name, *data_val, *llval;
    int r, ret, mod_name_len, nam_len, is_relative = -1, list_instance_position;
    int has_predicate, last_parsed = 0, llval_len;
    struct lyd_node *sibling, *last_match = NULL;
    struct lyd_node_leaf_list *llist;
    const struct lys_module *prev_mod;
    struct ly_ctx *ctx;
    const struct lys_node *ssibling, *sparent;
    struct lys_node_list *slist;
    struct parsed_pred pp;

    assert(nodeid && start && parsed);

    memset(&pp, 0, sizeof pp);
    ctx = start->schema->module->ctx;
    id = nodeid;

    /* parse first nodeid in case it is yang-data extension */
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        goto error;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            goto error;
        }
        id += r;
        last_parsed = r;
    } else {
        is_relative = -1;
    }

    /* parse first nodeid */
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        goto error;
    }
    id += r;
    /* add it to parsed only after the data node was actually found */
    last_parsed += r;

    if (is_relative) {
        prev_mod = lyd_node_module(start);
        start = (start->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF)) ? start->child : NULL;
    } else {
        for (; start->parent; start = start->parent);
        prev_mod = lyd_node_module(start);
    }
    if (!start) {
        /* there are no siblings to search */
        return NULL;
    }

    /* do not duplicate code, use predicate parsing from the loop */
    goto parse_predicates;

    while (1) {
        /* find the correct schema node first */
        ssibling = NULL;
        sparent = (start && start->parent) ? start->parent->schema : NULL;
        while ((ssibling = lys_getnext(ssibling, sparent, prev_mod, 0))) {
            /* skip invalid input/output nodes */
            if (sparent && (sparent->nodetype & (LYS_RPC | LYS_ACTION))) {
                if (options & LYD_PATH_OPT_OUTPUT) {
                    if (lys_parent(ssibling)->nodetype == LYS_INPUT) {
                        continue;
                    }
                } else {
                    if (lys_parent(ssibling)->nodetype == LYS_OUTPUT) {
                        continue;
                    }
                }
            }

            if (!schema_nodeid_siblingcheck(ssibling, prev_mod, mod_name, mod_name_len, name, nam_len)) {
                break;
            }
        }
        if (!ssibling) {
            /* there is not even such a schema node */
            free(pp.pred);
            return last_match;
        }
        pp.schema = ssibling;

        /* unify leaf-list value - it is possible to specify last-node value as both a predicate or parameter if
         * is a leaf-list, unify both cases and the value will in both cases be in the predicate structure */
        if (!id[0] && !pp.len && (ssibling->nodetype == LYS_LEAFLIST)) {
            pp.len = 1;
            pp.pred = calloc(1, sizeof *pp.pred);
            LY_CHECK_ERR_GOTO(!pp.pred, LOGMEM(ctx), error);

            pp.pred[0].name = ".";
            pp.pred[0].nam_len = 1;
            pp.pred[0].value = (llist_value ? llist_value : "");
            pp.pred[0].val_len = strlen(pp.pred[0].value);
        }

        if (ssibling->nodetype & (LYS_LEAFLIST | LYS_LEAF)) {
            /* check leaf/leaf-list predicate */
            if (pp.len > 1) {
                LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
                goto error;
            } else if (pp.len) {
                if ((pp.pred[0].name[0] != '.') || (pp.pred[0].nam_len != 1)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, pp.pred[0].name[0], pp.pred[0].name);
                    goto error;
                }
                if ((((struct lys_node_leaf *)ssibling)->type.base == LY_TYPE_IDENT) && !strnchr(pp.pred[0].value, ':', pp.pred[0].val_len)) {
                    LOGVAL(ctx, LYE_PATH_INIDENTREF, LY_VLOG_LYS, ssibling, pp.pred[0].val_len, pp.pred[0].value);
                    goto error;
                }
            }
        } else if (ssibling->nodetype == LYS_LIST) {
            /* list should have predicates for all the keys or position */
            slist = (struct lys_node_list *)ssibling;
            if (!pp.len) {
                /* none match */
                return last_match;
            } else if (!isdigit(pp.pred[0].name[0])) {
                /* list predicate is not a position, so there must be all the keys */
                if (pp.len > slist->keys_size) {
                    LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
                    goto error;
                } else if (pp.len < slist->keys_size) {
                    LOGVAL(ctx, LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, slist->keys[pp.len]->name);
                    goto error;
                }
                /* check that all identityrefs have module name, otherwise the hash of the list instance will never match!! */
                for (r = 0; r < pp.len; ++r) {
                    if ((slist->keys[r]->type.base == LY_TYPE_IDENT) && !strnchr(pp.pred[r].value, ':', pp.pred[r].val_len)) {
                        LOGVAL(ctx, LYE_PATH_INIDENTREF, LY_VLOG_LYS, slist->keys[r], pp.pred[r].val_len, pp.pred[r].value);
                        goto error;
                    }
                }
            }
        } else if (pp.pred) {
            /* no other nodes allow predicates */
            LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
            goto error;
        }

#ifdef LY_ENABLED_CACHE
        /* we will not be matching keyless lists or state leaf-lists this way */
        if (start->parent && start->parent->ht && ((pp.schema->nodetype != LYS_LIST) || ((struct lys_node_list *)pp.schema)->keys_size)
                && ((pp.schema->nodetype != LYS_LEAFLIST) || (pp.schema->flags & LYS_CONFIG_W))) {
            sibling = resolve_json_data_node_hash(start->parent, pp);
        } else
#endif
        {
            list_instance_position = 0;
            LY_TREE_FOR(start, sibling) {
                /* RPC/action data check, return simply invalid argument, because the data tree is invalid */
                if (lys_parent(sibling->schema)) {
                    if (options & LYD_PATH_OPT_OUTPUT) {
                        if (lys_parent(sibling->schema)->nodetype == LYS_INPUT) {
                            LOGERR(ctx, LY_EINVAL, "Provided data tree includes some RPC input nodes (%s).", sibling->schema->name);
                            goto error;
                        }
                    } else {
                        if (lys_parent(sibling->schema)->nodetype == LYS_OUTPUT) {
                            LOGERR(ctx, LY_EINVAL, "Provided data tree includes some RPC output nodes (%s).", sibling->schema->name);
                            goto error;
                        }
                    }
                }

                if (sibling->schema != ssibling) {
                    /* wrong schema node */
                    continue;
                }

                /* leaf-list, did we find it with the correct value or not? */
                if (ssibling->nodetype == LYS_LEAFLIST) {
                    if (ssibling->flags & LYS_CONFIG_R) {
                        /* state leaf-lists will never match */
                        continue;
                    }

                    llist = (struct lyd_node_leaf_list *)sibling;

                    /* get the expected leaf-list value */
                    llval = NULL;
                    llval_len = 0;
                    if (pp.pred) {
                        /* it was already checked that it is correct */
                        llval = pp.pred[0].value;
                        llval_len = pp.pred[0].val_len;

                    }

                    /* make value canonical (remove module name prefix) unless it was specified with it */
                    if (llval && !strchr(llval, ':') && (llist->value_type & LY_TYPE_IDENT)
                            && !strncmp(llist->value_str, lyd_node_module(sibling)->name, strlen(lyd_node_module(sibling)->name))
                            && (llist->value_str[strlen(lyd_node_module(sibling)->name)] == ':')) {
                        data_val = llist->value_str + strlen(lyd_node_module(sibling)->name) + 1;
                    } else {
                        data_val = llist->value_str;
                    }

                    if ((!llval && data_val && data_val[0]) || (llval && (strncmp(llval, data_val, llval_len)
                            || data_val[llval_len]))) {
                        continue;
                    }

                } else if (ssibling->nodetype == LYS_LIST) {
                    /* list, we likely need predicates'n'stuff then, but if without a predicate, we are always creating it */
                    ++list_instance_position;
                    ret = resolve_partial_json_data_list_predicate(pp, sibling, list_instance_position);
                    if (ret == -1) {
                        goto error;
                    } else if (ret == 1) {
                        /* this list instance does not match */
                        continue;
                    }
                }

                break;
            }
        }

        /* no match, return last match */
        if (!sibling) {
            free(pp.pred);
            return last_match;
        }

        /* we found a next matching node */
        *parsed += last_parsed;
        last_match = sibling;
        prev_mod = lyd_node_module(sibling);

        /* the result node? */
        if (!id[0]) {
            free(pp.pred);
            return last_match;
        }

        /* move down the tree, if possible, and continue */
        if (ssibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            /* there can be no children even through expected, error */
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
            goto error;
        } else if (!sibling->child) {
            /* there could be some children, but are not, return what we found so far */
            free(pp.pred);
            return last_match;
        }
        start = sibling->child;

        /* parse nodeid */
        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            goto error;
        }
        id += r;
        last_parsed = r;

parse_predicates:
        /* parse all the predicates */
        free(pp.pred);
        pp.schema = NULL;
        pp.len = 0;
        pp.pred = NULL;
        while (has_predicate) {
            ++pp.len;
            pp.pred = ly_realloc(pp.pred, pp.len * sizeof *pp.pred);
            LY_CHECK_ERR_GOTO(!pp.pred, LOGMEM(ctx), error);
            if ((r = parse_schema_json_predicate(id, &pp.pred[pp.len - 1].mod_name, &pp.pred[pp.len - 1].mod_name_len,
                                                 &pp.pred[pp.len - 1].name, &pp.pred[pp.len - 1].nam_len, &pp.pred[pp.len - 1].value,
                                                 &pp.pred[pp.len - 1].val_len, &has_predicate)) < 1) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                goto error;
            }

            id += r;
            last_parsed += r;
        }
    }

error:
    *parsed = -1;
    free(pp.pred);
    return NULL;
}